

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_null_with_null(void)

{
  undefined1 local_8b;
  undefined1 local_8a [2];
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_53;
  undefined1 local_52 [2];
  nullable local_50 [5];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1a,"void append_suite::append_null_with_null()",local_3a,&local_3b);
  local_50[0] = null;
  trial::dynamic::basic_variable<std::allocator<char>>::operator+=
            ((basic_variable<std::allocator<char>> *)local_38,local_50);
  local_52[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_53 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1c,"void append_suite::append_null_with_null()",local_52,&local_53);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  local_8a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_8b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x1e,"void append_suite::append_null_with_null()",local_8a,&local_8b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void append_null_with_null()
{
    variable data;
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
    data += null;
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
    data += variable();
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
}